

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O0

void capnp::_::PointerHelpers<capnp::List<unsigned_short,_(capnp::Kind)0>,_(capnp::Kind)6>::set
               (PointerBuilder builder,ArrayPtr<const_unsigned_short> value)

{
  StructDataBitCount *this;
  size_t sVar1;
  unsigned_short *puVar2;
  unsigned_short *element;
  unsigned_short *__end0;
  unsigned_short *__begin0;
  ArrayPtr<const_unsigned_short> *__range3;
  uint i;
  undefined1 local_40 [8];
  Builder l;
  ArrayPtr<const_unsigned_short> value_local;
  
  l.builder._32_8_ = value.ptr;
  sVar1 = kj::ArrayPtr<const_unsigned_short>::size
                    ((ArrayPtr<const_unsigned_short> *)&l.builder.structDataSize);
  init((PointerHelpers<capnp::List<unsigned_short,_(capnp::Kind)0>,_(capnp::Kind)6> *)local_40,
       (EVP_PKEY_CTX *)(sVar1 & 0xffffffff));
  __range3._4_4_ = 0;
  this = &l.builder.structDataSize;
  __end0 = kj::ArrayPtr<const_unsigned_short>::begin((ArrayPtr<const_unsigned_short> *)this);
  puVar2 = kj::ArrayPtr<const_unsigned_short>::end((ArrayPtr<const_unsigned_short> *)this);
  for (; __end0 != puVar2; __end0 = __end0 + 1) {
    List<unsigned_short,_(capnp::Kind)0>::Builder::set((Builder *)local_40,__range3._4_4_,*__end0);
    __range3._4_4_ = __range3._4_4_ + 1;
  }
  return;
}

Assistant:

static void set(PointerBuilder builder, kj::ArrayPtr<const ReaderFor<T>> value) {
    auto l = init(builder, value.size());
    uint i = 0;
    for (auto& element: value) {
      l.set(i++, element);
    }
  }